

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mtmd.cpp
# Opt level: O1

int32_t mtmd_helper_eval(mtmd_context *ctx,llama_context *lctx,mtmd_input_chunks *chunks,
                        llama_pos pos0,llama_seq_id seq_id,int32_t n_batch)

{
  long lVar1;
  mtmd_image_tokens *pmVar2;
  bool bVar3;
  int iVar4;
  int32_t iVar5;
  projector_type pVar6;
  long lVar7;
  uint uVar8;
  pointer pmVar9;
  char *pcVar10;
  ulong uVar11;
  pointer piVar12;
  undefined8 uVar13;
  ulong uVar14;
  pointer pmVar15;
  ulong uVar16;
  long lVar17;
  ulong uVar18;
  bool bVar19;
  llama_batch text_batch;
  decode_embd_batch batch_img;
  int local_174;
  int local_164;
  int local_148 [2];
  undefined4 uStack_140;
  undefined4 uStack_13c;
  undefined4 uStack_130;
  undefined4 uStack_12c;
  undefined4 local_128;
  undefined4 uStack_124;
  undefined4 uStack_120;
  undefined4 uStack_11c;
  long local_118;
  uint local_110;
  int local_10c;
  ulong local_108;
  pointer local_100;
  mtmd_input_chunks *local_f8;
  pointer local_f0;
  ulong local_e8;
  decode_embd_batch local_e0;
  
  llama_batch_init(local_148,n_batch,0,1);
  local_10c = clip_n_mmproj_embd(ctx->ctx_clip);
  pmVar15 = (chunks->super__Vector_base<mtmd_input_chunk,_std::allocator<mtmd_input_chunk>_>).
            _M_impl.super__Vector_impl_data._M_start;
  local_100 = (chunks->super__Vector_base<mtmd_input_chunk,_std::allocator<mtmd_input_chunk>_>).
              _M_impl.super__Vector_impl_data._M_finish;
  bVar19 = pmVar15 == local_100;
  local_f8 = chunks;
  if (!bVar19) {
    local_108 = (ulong)(n_batch - 1);
    local_110 = -n_batch;
    local_174 = pos0;
    do {
      pmVar9 = (local_f8->super__Vector_base<mtmd_input_chunk,_std::allocator<mtmd_input_chunk>_>).
               _M_impl.super__Vector_impl_data._M_finish + -1;
      if (pmVar15->type == MTMD_INPUT_CHUNK_TYPE_IMAGE) {
        if (pmVar15 == pmVar9) {
          pcVar10 = "!is_last && \"logits for last image chunk is not yet support\"";
          uVar13 = 0x1fc;
LAB_0012343c:
          uVar13 = ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/examples/llava/mtmd.cpp"
                              ,uVar13,"GGML_ASSERT(%s) failed",pcVar10);
          decode_embd_batch::~decode_embd_batch(&local_e0);
          _Unwind_Resume(uVar13);
        }
        if ((pmVar15->tokens_image)._M_t.
            super___uniq_ptr_impl<mtmd_image_tokens,_mtmd_image_tokens_deleter>._M_t.
            super__Tuple_impl<0UL,_mtmd_image_tokens_*,_mtmd_image_tokens_deleter>.
            super__Head_base<0UL,_mtmd_image_tokens_*,_false>._M_head_impl ==
            (mtmd_image_tokens *)0x0) {
          pcVar10 = "chunk.tokens_image != nullptr";
          uVar13 = 0x1fd;
          goto LAB_0012343c;
        }
        lVar7 = ggml_time_ms();
        if ((ctx->print_timings == true) && ((int)g_logger_state.verbosity_thold < 3)) {
          clip_log_internal(GGML_LOG_LEVEL_INFO,"encoding image or slice...\n");
        }
        iVar5 = mtmd_encode(ctx,(pmVar15->tokens_image)._M_t.
                                super___uniq_ptr_impl<mtmd_image_tokens,_mtmd_image_tokens_deleter>.
                                _M_t.
                                super__Tuple_impl<0UL,_mtmd_image_tokens_*,_mtmd_image_tokens_deleter>
                                .super__Head_base<0UL,_mtmd_image_tokens_*,_false>._M_head_impl);
        if (iVar5 == 0) {
          if ((ctx->print_timings == true) && ((int)g_logger_state.verbosity_thold < 3)) {
            lVar17 = ggml_time_ms();
            clip_log_internal(GGML_LOG_LEVEL_INFO,"image/slice encoded in %ld ms\n",lVar17 - lVar7);
          }
          pmVar2 = (pmVar15->tokens_image)._M_t.
                   super___uniq_ptr_impl<mtmd_image_tokens,_mtmd_image_tokens_deleter>._M_t.
                   super__Tuple_impl<0UL,_mtmd_image_tokens_*,_mtmd_image_tokens_deleter>.
                   super__Head_base<0UL,_mtmd_image_tokens_*,_false>._M_head_impl;
          uVar8 = pmVar2->ny * pmVar2->nx;
          local_e8 = (ulong)uVar8;
          uVar18 = (long)(int)((int)local_108 + uVar8 & local_110) / (long)n_batch;
          local_f0 = (ctx->image_embd_v).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start;
          pVar6 = clip_get_projector_type(ctx->ctx_clip);
          if (pVar6 == PROJECTOR_TYPE_GEMMA3) {
            llama_set_causal_attn(lctx,0);
          }
          uVar14 = 0;
          do {
            iVar4 = (int)uVar14;
            if ((int)uVar18 <= iVar4) {
              pVar6 = clip_get_projector_type(ctx->ctx_clip);
              bVar3 = true;
              if (pVar6 == PROJECTOR_TYPE_GEMMA3) {
                llama_set_causal_attn(lctx,1);
              }
              goto LAB_0012333d;
            }
            uVar8 = (int)local_e8 - iVar4 * n_batch;
            uVar16 = (ulong)uVar8;
            if (n_batch <= (int)uVar8) {
              uVar16 = (ulong)(uint)n_batch;
            }
            decode_embd_batch::decode_embd_batch
                      (&local_e0,local_f0 + iVar4 * n_batch * local_10c,(int)uVar16,local_174,0);
            uVar11 = (ulong)(iVar4 + 1);
            printf("decoding image batch %d/%d, n_tokens_batch = %d\n",uVar11,uVar18 & 0xffffffff,
                   uVar16);
            ggml_time_ms();
            iVar4 = llama_decode(lctx);
            if (iVar4 == 0) {
              if ((ctx->print_timings == true) && ((int)g_logger_state.verbosity_thold < 3)) {
                ggml_time_ms();
                clip_log_internal(GGML_LOG_LEVEL_INFO,"image decoded (batch %d/%d) in %ld ms\n",
                                  uVar11,uVar18 & 0xffffffff);
              }
              local_174 = local_174 + (int)uVar16;
            }
            else {
              if ((int)g_logger_state.verbosity_thold < 5) {
                clip_log_internal(GGML_LOG_LEVEL_ERROR,"failed to decode image\n");
              }
              llama_set_causal_attn(lctx,1);
              llama_batch_free();
              uVar11 = uVar14;
              local_164 = iVar4;
            }
            if (local_e0.logits.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_e0.logits.
                              super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                              super__Vector_impl_data._M_start,
                              (long)local_e0.logits.
                                    super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_e0.logits.
                                    super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                                    _M_impl.super__Vector_impl_data._M_start);
            }
            if (local_e0.seq_ids.super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_e0.seq_ids.super__Vector_base<int_*,_std::allocator<int_*>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)local_e0.seq_ids.
                                    super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
                                    super__Vector_impl_data._M_end_of_storage -
                              (long)local_e0.seq_ids.
                                    super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
                                    super__Vector_impl_data._M_start);
            }
            if (local_e0.seq_id_0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_e0.seq_id_0.super__Vector_base<int,_std::allocator<int>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)local_e0.seq_id_0.super__Vector_base<int,_std::allocator<int>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_e0.seq_id_0.super__Vector_base<int,_std::allocator<int>_>.
                                    _M_impl.super__Vector_impl_data._M_start);
            }
            if (local_e0.n_seq_id.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_e0.n_seq_id.super__Vector_base<int,_std::allocator<int>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)local_e0.n_seq_id.super__Vector_base<int,_std::allocator<int>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_e0.n_seq_id.super__Vector_base<int,_std::allocator<int>_>.
                                    _M_impl.super__Vector_impl_data._M_start);
            }
            if (local_e0.pos.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_e0.pos.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start,
                              (long)local_e0.pos.super__Vector_base<int,_std::allocator<int>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_e0.pos.super__Vector_base<int,_std::allocator<int>_>.
                                    _M_impl.super__Vector_impl_data._M_start);
            }
            uVar14 = uVar11;
          } while (iVar4 == 0);
        }
        else {
          if ((int)g_logger_state.verbosity_thold < 5) {
            clip_log_internal(GGML_LOG_LEVEL_ERROR,"failed to encode image\n");
          }
          llama_batch_free();
          local_164 = 1;
        }
        bVar3 = false;
LAB_0012333d:
        if (!bVar3) goto LAB_00122fe9;
LAB_0012334b:
        bVar3 = true;
      }
      else {
        if (pmVar15->type != MTMD_INPUT_CHUNK_TYPE_TEXT) {
          pcVar10 = "false && \"chunk type not supported\"";
          uVar13 = 0x234;
          goto LAB_0012343c;
        }
        local_148[0] = (int)((ulong)((long)(pmVar15->tokens_text).
                                           super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                           super__Vector_impl_data._M_finish -
                                    (long)(pmVar15->tokens_text).
                                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                          super__Vector_impl_data._M_start) >> 2);
        uVar18 = 0;
        do {
          uVar16 = uVar18;
          uVar14 = (long)(pmVar15->tokens_text).super__Vector_base<int,_std::allocator<int>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                   (long)(pmVar15->tokens_text).super__Vector_base<int,_std::allocator<int>_>.
                         _M_impl.super__Vector_impl_data._M_start >> 2;
          if (uVar14 <= uVar16) goto LAB_00122fe0;
          piVar12 = (pmVar15->tokens_text).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start;
          uVar18 = uVar16;
          if (local_148[0] < n_batch &&
              uVar16 < (ulong)((long)(pmVar15->tokens_text).
                                     super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_finish - (long)piVar12 >> 2)) {
            lVar7 = uVar16 * 4;
            lVar17 = 0;
            do {
              *(int *)(CONCAT44(uStack_13c,uStack_140) + lVar7 + lVar17 * 4) =
                   piVar12[uVar16 + lVar17];
              *(int *)(CONCAT44(uStack_12c,uStack_130) + lVar7 + lVar17 * 4) =
                   local_174 + (int)lVar17;
              *(undefined4 *)(CONCAT44(uStack_124,local_128) + lVar7 + lVar17 * 4) = 1;
              **(llama_seq_id **)(CONCAT44(uStack_11c,uStack_120) + uVar16 * 8 + lVar17 * 8) =
                   seq_id;
              *(undefined1 *)(lVar17 + local_118 + uVar16) = 0;
              lVar1 = lVar17 + uVar16;
              piVar12 = (pmVar15->tokens_text).super__Vector_base<int,_std::allocator<int>_>._M_impl
                        .super__Vector_impl_data._M_start;
              lVar17 = lVar17 + 1;
              if ((ulong)((long)(pmVar15->tokens_text).super__Vector_base<int,_std::allocator<int>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)piVar12 >> 2) <=
                  lVar1 + 1U) break;
            } while (local_148[0] < n_batch);
            local_174 = local_174 + (int)lVar17;
            uVar18 = lVar17 + uVar16;
          }
          if (pmVar15 == pmVar9) {
            *(undefined1 *)(local_118 + -1 + (long)local_148[0]) = 1;
          }
          iVar4 = llama_decode(lctx);
        } while (iVar4 == 0);
        if ((int)g_logger_state.verbosity_thold < 5) {
          clip_log_internal(GGML_LOG_LEVEL_ERROR,"failed to decode text\n");
        }
        llama_batch_free();
        local_164 = iVar4;
LAB_00122fe0:
        if (uVar14 <= uVar16) goto LAB_0012334b;
LAB_00122fe9:
        bVar3 = false;
      }
      if (!bVar3) break;
      pmVar15 = pmVar15 + 1;
      bVar19 = pmVar15 == local_100;
    } while (!bVar19);
  }
  if (bVar19) {
    llama_batch_free();
    local_164 = 0;
  }
  return local_164;
}

Assistant:

int32_t mtmd_helper_eval(mtmd_context * ctx,
        llama_context * lctx,
        mtmd_input_chunks & chunks,
        llama_pos pos0,
        llama_seq_id seq_id,
        int32_t n_batch) {
    int32_t ret;
    llama_pos n_past = pos0;
    llama_batch text_batch = llama_batch_init(n_batch, 0, 1);
    int n_mmproj_embd = clip_n_mmproj_embd(ctx->ctx_clip);

    for (auto & chunk : chunks) {
        bool is_last = &chunk == &chunks.back();
        if (chunk.type == MTMD_INPUT_CHUNK_TYPE_TEXT) {
            text_batch.n_tokens = chunk.tokens_text.size();
            size_t i = 0;
            while (i < chunk.tokens_text.size()) { // split into batches
                for (; i < chunk.tokens_text.size() && text_batch.n_tokens < n_batch; i++) {
                    text_batch.token   [i]    = chunk.tokens_text[i];
                    text_batch.pos     [i]    = n_past++;
                    text_batch.n_seq_id[i]    = 1;
                    text_batch.seq_id  [i][0] = seq_id;
                    text_batch.logits  [i]    = false;
                }
                if (is_last) {
                    // always get logits for last input chunk
                    text_batch.logits[text_batch.n_tokens - 1] = true;
                }
                ret = llama_decode(lctx, text_batch);
                if (ret != 0) {
                    LOG_ERR("failed to decode text\n");
                    llama_batch_free(text_batch);
                    return ret;
                }
            }

        } else if (chunk.type == MTMD_INPUT_CHUNK_TYPE_IMAGE) {
            GGML_ASSERT(!is_last && "logits for last image chunk is not yet support");
            GGML_ASSERT(chunk.tokens_image != nullptr);
            int64_t t0 = ggml_time_ms();
            if (ctx->print_timings) {
                LOG_INF("encoding image or slice...\n");
            }
            ret = mtmd_encode(ctx, chunk.tokens_image.get());
            if (ret != 0) {
                LOG_ERR("failed to encode image\n");
                llama_batch_free(text_batch);
                return ret;
            }
            if (ctx->print_timings) {
                LOG_INF("image/slice encoded in %" PRId64 " ms\n", ggml_time_ms() - t0);
            }

            int32_t n_tokens = mtmd_image_tokens_get_n_tokens(chunk.tokens_image.get());
            int32_t i_batch = 0;
            int32_t n_img_batches = GGML_PAD(n_tokens, n_batch) / n_batch;
            float * embd = mtmd_get_output_embd(ctx);

            if (mtmd_decode_use_non_causal(ctx)) {
                llama_set_causal_attn(lctx, false);
                // TODO @ngxson : need to make sure only one image is processed at a time, and n_ubatch must be enough to hold the image
            }

            while (i_batch < n_img_batches) { // split into batches
                int32_t pos_offset = i_batch*n_batch;
                int32_t n_tokens_batch = std::min(n_batch, n_tokens - pos_offset);
                float * embd_batch = embd + pos_offset*n_mmproj_embd;
                decode_embd_batch batch_img(embd_batch, n_tokens_batch, n_past, 0);

                printf("decoding image batch %d/%d, n_tokens_batch = %d\n", i_batch+1, n_img_batches, n_tokens_batch);

                int64_t t1 = ggml_time_ms();
                ret = llama_decode(lctx, batch_img.batch);
                if (ret != 0) {
                    LOG_ERR("failed to decode image\n");
                    llama_set_causal_attn(lctx, true); // restore causal attn
                    llama_batch_free(text_batch);
                    return ret;
                }

                if (ctx->print_timings) {
                    LOG_INF("image decoded (batch %d/%d) in %" PRId64 " ms\n", i_batch+1, n_img_batches, ggml_time_ms() - t1);
                }

                i_batch++;
                n_past += n_tokens_batch;
            }

            if (mtmd_decode_use_non_causal(ctx)) {
                llama_set_causal_attn(lctx, true);
            }

        } else {
            GGML_ASSERT(false && "chunk type not supported");
        }
    }

    llama_batch_free(text_batch);
    return 0;
}